

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O1

void __thiscall Epoll::epoll_mod(Epoll *this,SP_Channel *request,int timeout)

{
  __uint32_t _Var1;
  element_type *peVar2;
  int iVar3;
  epoll_event event;
  shared_ptr<Channel> local_38;
  __uint32_t local_24;
  int local_20;
  
  if (0 < timeout) {
    local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_M_use_count + 1;
      }
    }
    add_time(this,&local_38,timeout);
    if (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
    }
  }
  local_20 = Channel::getFd((request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr);
  peVar2 = (request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_24 = peVar2->events_;
  _Var1 = peVar2->lastEvents_;
  peVar2->lastEvents_ = local_24;
  if (_Var1 != local_24) {
    iVar3 = epoll_ctl(this->epollFd_,3,local_20,(epoll_event *)&local_24);
    if (iVar3 < 0) {
      epoll_mod();
    }
  }
  return;
}

Assistant:

void Epoll::epoll_mod(SP_Channel request, int timeout){
    if(timeout > 0) add_time(request, timeout);
    int fd=request->getFd();
    if(!request->EqualAndUpdateLastEvents()){
        struct epoll_event event;
        event.data.fd=fd;
        event.events=request->getEvents();
        if(epoll_ctl(epollFd_, EPOLL_CTL_MOD, fd, &event)<0){
            perror("epoll_mod error");
            fd2chan_[fd].reset();
        }
    }
}